

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEC.h
# Opt level: O1

Estimates * SEC(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  long v2;
  VertexIdx *pVVar1;
  double dVar2;
  EdgeInfo e_struct;
  Parameters params_00;
  pointer pOVar3;
  pointer pOVar4;
  uint uVar5;
  EdgeIdx *pEVar6;
  ulong uVar7;
  ulong *puVar8;
  size_t __i;
  long lVar9;
  long lVar10;
  ulong uVar11;
  Estimates *pEVar12;
  ulong uVar13;
  ulong *puVar14;
  int iVar15;
  byte bVar16;
  double dVar17;
  double dVar18;
  OrderedEdgeCollection randomEdgeCollection;
  Estimates edge_count_output;
  random_device rd;
  mt19937 mt;
  ulong in_stack_ffffffffffffc2d8;
  undefined8 in_stack_ffffffffffffc2e0;
  undefined8 in_stack_ffffffffffffc2e8;
  undefined1 in_stack_ffffffffffffc2f0 [144];
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> local_2998;
  vector<bool,_std::allocator<bool>_> vStack_2980;
  vector<bool,_std::allocator<bool>_> vStack_2958;
  long lStack_2930;
  Estimates *local_2928;
  ulong local_2920;
  double local_2918;
  long local_2910;
  long local_2908;
  long local_2900;
  double local_28f8;
  OrderedEdgeCollection local_28f0;
  long local_2878;
  long lStack_2870;
  EdgeIdx local_2868;
  Estimates local_2860;
  ulong *local_2840;
  undefined4 uStack_2838;
  undefined4 uStack_2834;
  ulong *local_2830;
  undefined4 uStack_2828;
  undefined4 uStack_2824;
  _Bit_pointer local_2820;
  ulong *local_2818;
  undefined4 uStack_2810;
  undefined4 uStack_280c;
  ulong *local_2808;
  undefined4 uStack_2800;
  undefined4 uStack_27fc;
  _Bit_pointer local_27f8;
  long local_27f0;
  Parameters local_27e8;
  random_device local_2740;
  ulong local_13b8 [624];
  undefined8 local_38;
  
  bVar16 = 0;
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ =
       vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ =
       vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  lStack_2930 = 0;
  std::random_device::random_device(&local_2740);
  uVar5 = std::random_device::_M_getval();
  uVar13 = (ulong)uVar5;
  local_13b8[0] = uVar13;
  lVar9 = 1;
  do {
    uVar13 = (ulong)(((uint)(uVar13 >> 0x1e) ^ (uint)uVar13) * 0x6c078965 + (int)lVar9);
    local_13b8[lVar9] = uVar13;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x270);
  local_38 = 0x270;
  puVar8 = local_13b8;
  puVar14 = (ulong *)&stack0xffffffffffffc2d8;
  for (lVar9 = 0x271; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar14 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar16 * -2 + 1;
    puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
  }
  GetEdgesByUniSampling(&local_2860,cg,params);
  dVar2 = local_2860.estimate;
  pOVar4 = local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pOVar3 = local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar15 = (int)lVar9;
  local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2860.fraction_of_vertices_seen;
  local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2860.fraction_of_edges_seen;
  local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_2860.query_complexity;
  local_2860.fraction_of_vertices_seen = 0.0;
  local_2860.fraction_of_edges_seen = 0.0;
  local_2860.query_complexity = 0.0;
  if (pOVar3 != (pointer)0x0) {
    operator_delete(pOVar3,(long)pOVar4 - (long)pOVar3);
  }
  local_2928 = __return_storage_ptr__;
  if (vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_2820;
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = CONCAT44(uStack_2834,uStack_2838);
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = CONCAT44(uStack_2824,uStack_2828);
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = local_2830;
  vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = local_2840;
  local_2840 = (ulong *)0x0;
  uStack_2838 = 0;
  local_2830 = (ulong *)0x0;
  uStack_2828 = 0;
  local_2820 = (_Bit_pointer)0x0;
  if (vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_27f8;
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = CONCAT44(uStack_280c,uStack_2810);
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = CONCAT44(uStack_27fc,uStack_2800);
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = local_2808;
  vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = local_2818;
  local_2818 = (ulong *)0x0;
  uStack_2810 = 0;
  local_2808 = (ulong *)0x0;
  uStack_2800 = 0;
  local_27f8 = (_Bit_pointer)0x0;
  lStack_2930 = local_27f0;
  if (local_2840 != (ulong *)0x0) {
    operator_delete(local_2840,(long)local_2820 - (long)local_2840);
    local_2840 = (ulong *)0x0;
    uStack_2838 = 0;
    local_2830 = (ulong *)0x0;
    uStack_2828 = 0;
    local_2820 = (_Bit_pointer)0x0;
  }
  if ((void *)local_2860.fraction_of_vertices_seen != (void *)0x0) {
    operator_delete((void *)local_2860.fraction_of_vertices_seen,
                    (long)local_2860.query_complexity - (long)local_2860.fraction_of_vertices_seen);
  }
  if (params->normalization_count_available == false) {
    local_28f0.no_of_edges = (EdgeIdx)dVar2;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              (&local_28f0.edge_list,&local_2998);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_28f0.visited_edge_set,&vStack_2980);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_28f0.visited_vertex_set,&vStack_2958);
    local_28f0.no_of_query = lStack_2930;
    Parameters::Parameters(&local_27e8,params);
    pEVar12 = local_2928;
    params_00.filename._M_string_length = in_stack_ffffffffffffc2e0;
    params_00.filename._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc2d8;
    params_00.filename.field_2._M_allocated_capacity = in_stack_ffffffffffffc2e8;
    params_00._24_144_ = in_stack_ffffffffffffc2f0;
    EstimateEdgeCount(&local_2860,cg,&local_28f0,params_00,iVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.out_directory._M_dataplus._M_p != &local_27e8.out_directory.field_2) {
      operator_delete(local_27e8.out_directory._M_dataplus._M_p,
                      local_27e8.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.algo_name._M_dataplus._M_p != &local_27e8.algo_name.field_2) {
      operator_delete(local_27e8.algo_name._M_dataplus._M_p,
                      local_27e8.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.filename._M_dataplus._M_p != &local_27e8.filename.field_2) {
      operator_delete(local_27e8.filename._M_dataplus._M_p,
                      local_27e8.filename.field_2._M_allocated_capacity + 1);
    }
    if (local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     );
      local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_28f0.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl
                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
      ;
      local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_28f0.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_28f0.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28f0.edge_list.
                      super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28f0.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28f0.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    local_2860.estimate = (double)cg->nEdges;
    pEVar12 = local_2928;
  }
  lVar9 = (long)local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_start >> 5;
  dVar2 = 0.0;
  dVar18 = 0.0;
  if (0 < lVar9) {
    local_2920 = (ulong)((int)((lVar9 - 1U) / 500) + 1);
    lVar10 = 0;
    local_2918 = local_2860.estimate;
    local_2910 = lVar9;
    do {
      lVar9 = local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10].u;
      v2 = local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10].v;
      local_2868 = local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10].index;
      e_struct.dest = v2;
      e_struct.src = lVar9;
      e_struct.index = local_2868;
      local_2900 = lVar10;
      local_28f8 = dVar18;
      local_2878 = lVar9;
      lStack_2870 = v2;
      local_2908 = TriangleByEdge(cg,e_struct);
      pEVar6 = cg->offsets;
      lVar10 = lVar9;
      if (pEVar6[v2 + 1] - pEVar6[v2] < pEVar6[lVar9 + 1] - pEVar6[lVar9]) {
        lVar10 = v2;
        v2 = lVar9;
      }
      for (uVar13 = pEVar6[lVar10]; (long)uVar13 < pEVar6[lVar10 + 1]; uVar13 = uVar13 + 1) {
        pVVar1 = cg->nbors;
        uVar7 = pVVar1[uVar13];
        uVar11 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar11 = uVar7;
        }
        vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar11 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p
             [((long)uVar11 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] | 1L << ((byte)uVar7 & 0x3f);
        uVar7 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar7 = uVar13;
        }
        vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar7 >> 6) + ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p
             [((long)uVar7 >> 6) + ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] | 1L << ((byte)uVar13 & 0x3f);
        uVar7 = Escape::CGraph::getEdgeBinary(cg,pVVar1[uVar13],v2);
        if (uVar7 != 0xffffffffffffffff) {
          uVar11 = uVar7 + 0x3f;
          if (-1 < (long)uVar7) {
            uVar11 = uVar7;
          }
          vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar11 >> 6) + ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar11 >> 6) +
                ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
               1L << ((byte)uVar7 & 0x3f);
        }
        lStack_2930 = lStack_2930 + 2;
        pEVar6 = cg->offsets;
      }
      dVar18 = local_28f8 + (double)local_2908;
      lVar10 = local_2900 + 500;
    } while (lVar10 < local_2910);
    dVar2 = (double)(int)local_2920 * 6.0;
    pEVar12 = local_2928;
    local_2860.estimate = local_2918;
  }
  dVar17 = 0.0;
  pEVar12->fraction_of_vertices_seen = 1.0;
  pEVar12->fraction_of_edges_seen = 1.0;
  pEVar12->query_complexity = 1.0;
  pEVar12->estimate = (local_2860.estimate / dVar2) * dVar18;
  if (vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    lVar9 = 0;
    uVar13 = 0;
    puVar8 = vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p;
    do {
      lVar9 = lVar9 + (ulong)((*puVar8 >> (uVar13 & 0x3f) & 1) != 0);
      iVar15 = (int)uVar13;
      puVar8 = puVar8 + (iVar15 == 0x3f);
      uVar13 = (ulong)(iVar15 + 1);
      if (iVar15 == 0x3f) {
        uVar13 = 0;
      }
    } while ((uint)uVar13 !=
             vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_finish.super__Bit_iterator_base._M_offset ||
             puVar8 != vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
    dVar17 = (double)lVar9 * 100.0;
  }
  dVar2 = 0.0;
  if (vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    lVar9 = 0;
    uVar13 = 0;
    puVar8 = vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p;
    do {
      lVar9 = lVar9 + (ulong)((*puVar8 >> (uVar13 & 0x3f) & 1) != 0);
      iVar15 = (int)uVar13;
      puVar8 = puVar8 + (iVar15 == 0x3f);
      uVar13 = (ulong)(iVar15 + 1);
      if (iVar15 == 0x3f) {
        uVar13 = 0;
      }
    } while ((uint)uVar13 !=
             vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_finish.super__Bit_iterator_base._M_offset ||
             puVar8 != vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
    dVar2 = (double)lVar9 * 100.0;
  }
  pEVar12->fraction_of_vertices_seen = dVar2 / (double)cg->nVertices;
  lVar9 = cg->nEdges;
  pEVar12->fraction_of_edges_seen = dVar17 / (double)lVar9;
  pEVar12->query_complexity = ((double)lStack_2930 * 100.0) / (double)lVar9;
  std::random_device::_M_fini();
  if (vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_p = (ulong *)0x0;
    vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._8_8_ =
         vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (ulong *)0x0;
    vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    vStack_2958.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_p = (ulong *)0x0;
    vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._8_8_ =
         vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (ulong *)0x0;
    vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    vStack_2980.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2998.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pEVar12;
}

Assistant:

Estimates SEC(CGraph *cg, Parameters params)
{
    /**
    * Set up local variables. skip parameter is used in estimating the number of edges in the graph.
    */
    OrderedEdgeCollection randomEdgeCollection;
    double running_count = 0.0, edge_estimate=0.0;
    int skip = 1;

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Perform a random walk through the graph, and collect the edges in the process
     * The fourth parameter is set to false to indicate that we do not care about the
     * vertex ordering of each edge
     */
    randomEdgeCollection = GetEdgesByUniSampling(cg, params, mt);

    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    /** We now go over the edges collected by the random walk and count the
     * number of triangles incident on each edge.
     * However, we can not do this for every edge as it would be too expensive.
     * Instead, we perform this task for a small fraction of the total edges in the random walk
     */
    int sparsity = 500, no_of_samples=0;
    EdgeIdx total_edge = randomEdgeCollection.edge_list.size();

    for (VertexIdx i=0; i<total_edge; i=i+sparsity) {
        EdgeInfo e_struct;
        VertexIdx parent,child;
        parent = randomEdgeCollection.edge_list[i].u;
        child = randomEdgeCollection.edge_list[i].v;

        e_struct.index = randomEdgeCollection.edge_list[i].index;
        e_struct.src = parent;
        e_struct.dest = child;
        running_count += TriangleByEdge(cg,e_struct);
        no_of_samples++;
        /**
         * Now for the vertex with lesser degree, we visit all of its neighbors
         * and all the incident edges on it we copy the lower degree vertex in src.
         * Update relevant data structure and also update query complexity
         */
        VertexIdx src,dst;
        if (cg->degree(parent) > cg-> degree(child)) {
            src = child;
            dst = parent;
        }
        else {
            src = parent;
            dst = child;
        }
        for (EdgeIdx idx = cg->offsets[src]; idx <cg->offsets[src+1];idx++ ) {
            randomEdgeCollection.visited_vertex_set[cg->nbors[idx]] = true;
            randomEdgeCollection.visited_edge_set[idx] = true;
            EdgeIdx e2 = cg->getEdgeBinary(cg->nbors[idx],dst);
            if (e2!= -1) {
                randomEdgeCollection.visited_edge_set[e2] = true;
            }
            randomEdgeCollection.no_of_query = randomEdgeCollection.no_of_query + 2;
        }
    }



    double scale = 1.0* edge_estimate / (6.0*no_of_samples);
    double triangleEstimate = running_count * scale ;
    //printf("p=%lf,  scale = %lf \n",p,scale);
//    printf ("Multi: %lld,  %lf\n",visited_edge_set.size(),triangleEstimate);

    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(randomEdgeCollection.visited_edge_set.begin(),randomEdgeCollection.visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(randomEdgeCollection.visited_vertex_set.begin(),randomEdgeCollection.visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / cg->nVertices;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / cg->nEdges;
    return_estimate.query_complexity = randomEdgeCollection.no_of_query * 100.0 /cg->nEdges;

    //    return_estimate.fraction_of_vertices_seen = visited_with_nbor_vertex_set.size() * 100.0 / n;
//    return_estimate.fraction_of_edges_seen = visited_with_nbor_edge_set.size() * 100.0 / m;
    // Why the multiplication by 2? The fraction of edges seen is effectively
    // compared against all the entries in the adjacency list, which is 2m.

    return return_estimate;
}